

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O2

GraphNode * raviX_add_node(Graph *g,nodeId_t index)

{
  GraphNode **ppGVar1;
  GraphNode *pGVar2;
  uint uVar3;
  ulong old_n;
  
  uVar3 = g->allocated;
  old_n = (ulong)uVar3;
  if (index < uVar3) {
    if (g->nodes[index] != (GraphNode *)0x0) {
      return g->nodes[index];
    }
  }
  else {
    uVar3 = index + 8;
    ppGVar1 = (GraphNode **)raviX_realloc_array(g->nodes,8,old_n,(ulong)uVar3);
    g->allocated = uVar3;
    g->nodes = ppGVar1;
  }
  if (uVar3 <= index) {
    __assert_fail("index < g->allocated",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                  ,199,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
  }
  pGVar2 = (GraphNode *)(*g->node_allocator->calloc)(g->node_allocator->arena,1,0x30);
  if (pGVar2->pre != 0) {
    __assert_fail("n->pre == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                  ,0xc9,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
  }
  if (pGVar2->rpost == 0) {
    *(undefined4 *)&pGVar2->preds = 0;
    (pGVar2->preds).links = (GraphNodeLink *)0x0;
    *(undefined4 *)&pGVar2->succs = 0;
    (pGVar2->succs).links = (GraphNodeLink *)0x0;
    pGVar2->index = index;
    g->nodes[index] = pGVar2;
    return pGVar2;
  }
  __assert_fail("n->rpost == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                ,0xca,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
}

Assistant:

static GraphNode *raviX_add_node(Graph *g, nodeId_t index)
{
	if (index < g->allocated && g->nodes[index] != NULL) {
		// already allocated
		return g->nodes[index];
	}
	if (index >= g->allocated) {
		raviX_graph_grow(g, index);
	}
	assert(index < g->allocated);
	GraphNode *n = (GraphNode *) g->node_allocator->calloc(g->node_allocator->arena, 1, sizeof(GraphNode));
	assert(n->pre == 0);
	assert(n->rpost == 0);
	node_list_init(&n->preds);
	node_list_init(&n->succs);
	/* note that each node must have an index such that n = nodes[index] */
	n->index = index;
	g->nodes[index] = n;
	return n;
}